

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_hashtable.cc
# Opt level: O1

RC __thiscall PF_HashTable::Delete(PF_HashTable *this,int fd,PageNum pageNum)

{
  PF_HashEntry **ppPVar1;
  PF_HashEntry *pPVar2;
  int iVar3;
  PF_HashEntry *pPVar4;
  
  iVar3 = (pageNum + fd) % this->numBuckets;
  ppPVar1 = this->hashTable;
  pPVar4 = ppPVar1[iVar3];
  while( true ) {
    if (pPVar4 == (PF_HashEntry *)0x0) {
      return -8;
    }
    if ((pPVar4->fd == fd) && (pPVar4->pageNum == pageNum)) break;
    pPVar4 = pPVar4->next;
  }
  if (pPVar4 == ppPVar1[iVar3]) {
    ppPVar1[iVar3] = pPVar4->next;
  }
  pPVar2 = pPVar4->prev;
  if (pPVar2 != (PF_HashEntry *)0x0) {
    pPVar2->next = pPVar4->next;
  }
  if (pPVar4->next != (PF_HashEntry *)0x0) {
    pPVar4->next->prev = pPVar2;
  }
  operator_delete(pPVar4);
  return 0;
}

Assistant:

RC PF_HashTable::Delete(int fd, PageNum pageNum)
{
  // Get which bucket it should be in
  int bucket = Hash(fd, pageNum);

  // Find the entry is in this bucket
  PF_HashEntry *entry;
  for (entry = hashTable[bucket];
       entry != NULL;
       entry = entry->next) {
    if (entry->fd == fd && entry->pageNum == pageNum)
      break;
  }

  // Did we find hash entry?
  if (entry == NULL)
    return (PF_HASHNOTFOUND);

  // Remove this entry
  if (entry == hashTable[bucket])
    hashTable[bucket] = entry->next;
  if (entry->prev != NULL)
    entry->prev->next = entry->next;
  if (entry->next != NULL)
    entry->next->prev = entry->prev;
  delete entry;

  // Return ook
  return (0);
}